

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

bool checkInterfacePropertyCompatibility<bool>
               (cmGeneratorTarget *tgt,string *p,string *config,char *defaultValue,CompatibleType t,
               bool *param_6)

{
  cmGeneratorTarget *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__ptr;
  pointer pbVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  cmPropertyMap *pcVar6;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var7;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *pvVar8;
  string *psVar9;
  ostream *poVar10;
  string *psVar11;
  size_t sVar12;
  uint uVar13;
  pointer ppcVar14;
  char *pcVar15;
  bool bVar16;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string reportEntry;
  string report;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propKeys;
  ostringstream e;
  string interfaceProperty;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headPropKeys;
  uint local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_298;
  cmGeneratorTarget *local_290;
  undefined1 local_288 [32];
  string *local_268;
  string local_260;
  _Base_ptr local_240;
  _Base_ptr local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  pointer local_200;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  undefined1 local_1e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  pointer local_1c0;
  undefined8 local_1b8;
  ios_base local_170 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_290 = tgt;
  bVar4 = cmTarget::GetPropertyAsBool(tgt->Target,p);
  local_2a0 = (uint)bVar4;
  pcVar6 = cmTarget::GetProperties(tgt->Target);
  cmPropertyMap::GetKeys_abi_cxx11_(&local_48,pcVar6);
  _Var7 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    (local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,p);
  bVar16 = _Var7._M_current !=
           local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_240 = (_Base_ptr)
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(tgt->LinkImplicitNullProperties)._M_t,p);
  local_230 = local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_238 = &(tgt->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_228 = _Var7._M_current;
  if (local_240 != local_238 &&
      _Var7._M_current !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("(impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0x18d2,
                  "PropertyType checkInterfacePropertyCompatibility(const cmGeneratorTarget *, const std::string &, const std::string &, const char *, CompatibleType, PropertyType *) [PropertyType = bool]"
                 );
  }
  pvVar8 = cmGeneratorTarget::GetLinkImplementationClosure(local_290,config);
  if ((pvVar8->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (pvVar8->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    psVar9 = cmTarget::GetName_abi_cxx11_(local_290->Target);
    local_1e0._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0xb;
    local_1e0._8_8_ = " * Target \"";
    local_1d0._M_allocated_capacity = 0;
    local_1c0 = (psVar9->_M_dataplus)._M_p;
    local_1d0._8_8_ = psVar9->_M_string_length;
    local_1b8 = 0;
    views._M_len = 2;
    views._M_array = (iterator)local_1e0;
    cmCatViews((string *)&local_220,views);
    local_268 = p;
    if (local_228 != local_230) {
      std::__cxx11::string::append(local_220._M_local_buf);
      pcVar15 = "FALSE";
      if (bVar4) {
        pcVar15 = "TRUE";
      }
      local_1e0._0_8_ = &local_1d0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1e0,pcVar15,pcVar15 + ((ulong)bVar4 ^ 5));
      std::__cxx11::string::_M_append(local_220._M_local_buf,local_1e0._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._0_8_ != &local_1d0) {
        operator_delete((void *)local_1e0._0_8_,(ulong)(local_1d0._M_allocated_capacity + 1));
      }
    }
    psVar9 = local_268;
    std::__cxx11::string::append(local_220._M_local_buf);
    std::operator+(&local_68,"INTERFACE_",psVar9);
    local_298 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
    iVar5 = std::__cxx11::string::compare((char *)psVar9);
    if (iVar5 == 0) {
      local_288._0_8_ = local_290->LocalGenerator;
      std::
      make_unique<cmGeneratorExpressionInterpreter,cmLocalGenerator*,std::__cxx11::string_const&,cmGeneratorTarget_const*&>
                ((cmLocalGenerator **)local_1e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,
                 (cmGeneratorTarget **)config);
      uVar3 = local_1e0._0_8_;
      __ptr = local_298;
      local_298 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e0._0_8_;
      local_1e0._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      if ((__ptr != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) &&
         (std::default_delete<cmGeneratorExpressionInterpreter>::operator()
                    ((default_delete<cmGeneratorExpressionInterpreter> *)&local_298,
                     (cmGeneratorExpressionInterpreter *)__ptr),
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_1e0._0_8_ !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0)) {
        std::default_delete<cmGeneratorExpressionInterpreter>::operator()
                  ((default_delete<cmGeneratorExpressionInterpreter> *)local_1e0,
                   (cmGeneratorExpressionInterpreter *)local_1e0._0_8_);
      }
    }
    ppcVar14 = (pvVar8->
               super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    local_200 = (pvVar8->
                super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    if (ppcVar14 != local_200) {
      do {
        pcVar1 = *ppcVar14;
        pcVar6 = cmTarget::GetProperties(pcVar1->Target);
        cmPropertyMap::GetKeys_abi_cxx11_(&local_1f8,pcVar6);
        _Var7 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          (local_1f8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           local_1f8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_68);
        pbVar2 = local_1f8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        bVar4 = getTypedProperty<bool>
                          (pcVar1,&local_68,(cmGeneratorExpressionInterpreter *)local_298);
        local_288._0_8_ = local_288 + 0x10;
        local_288._8_8_ = 0;
        local_288[0x10] = '\0';
        if (_Var7._M_current == pbVar2) {
          uVar13 = local_2a0;
          if (local_240 != local_238) {
            uVar13 = 0;
          }
          if (local_228 != local_230) {
            uVar13 = local_2a0;
          }
          iVar5 = 3;
          local_2a0 = uVar13;
        }
        else {
          std::__cxx11::string::append(local_288);
          psVar9 = cmTarget::GetName_abi_cxx11_(pcVar1->Target);
          std::__cxx11::string::_M_append(local_288,(ulong)(psVar9->_M_dataplus)._M_p);
          std::__cxx11::string::append(local_288);
          pcVar15 = "FALSE";
          if (bVar4) {
            pcVar15 = "TRUE";
          }
          local_1e0._0_8_ = &local_1d0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1e0,pcVar15,pcVar15 + ((ulong)bVar4 ^ 5));
          std::__cxx11::string::_M_append(local_288,local_1e0._0_8_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e0._0_8_ != &local_1d0) {
            operator_delete((void *)local_1e0._0_8_,(ulong)(local_1d0._M_allocated_capacity + 1));
          }
          std::__cxx11::string::append(local_288);
          if (local_228 == local_230) {
            if (local_240 == local_238) {
              if (bVar16) {
                std::__cxx11::string::_M_append(local_220._M_local_buf,local_288._0_8_);
                compatibilityAgree_abi_cxx11_((string *)local_1e0,t,false);
                std::__cxx11::string::_M_append(local_220._M_local_buf,local_1e0._0_8_);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e0._0_8_ != &local_1d0) {
                  operator_delete((void *)local_1e0._0_8_,
                                  (ulong)(local_1d0._M_allocated_capacity + 1));
                }
                iVar5 = 3;
                bVar16 = true;
                bVar4 = bVar4 != local_2a0._0_1_;
                if (bVar4) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1e0,"The INTERFACE_",0xe);
                  psVar9 = local_268;
                  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_1e0,(local_268->_M_dataplus)._M_p,
                                       local_268->_M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10," property of \"",0xe);
                  psVar11 = cmTarget::GetName_abi_cxx11_(pcVar1->Target);
                  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar10,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length
                                      );
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,"\" does\nnot agree with the value of ",0x23);
                  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar10,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10," already determined\nfor \"",0x19);
                  psVar9 = cmTarget::GetName_abi_cxx11_(local_290->Target);
                  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar10,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\".\n",3);
                  std::__cxx11::stringbuf::str();
                  cmSystemTools::Error(&local_260);
                  goto LAB_004c5b2c;
                }
              }
              else {
                local_1e0._0_8_ = &local_1d0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_1e0,local_288._0_8_,
                           (pointer)(local_288._0_8_ + local_288._8_8_));
                std::__cxx11::string::append((char *)local_1e0);
                std::__cxx11::string::_M_append(local_220._M_local_buf,local_1e0._0_8_);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e0._0_8_ != &local_1d0) {
                  operator_delete((void *)local_1e0._0_8_,
                                  (ulong)(local_1d0._M_allocated_capacity + 1));
                }
                iVar5 = 0;
                bVar16 = true;
                local_2a0 = (uint)bVar4;
              }
            }
            else {
              std::__cxx11::string::_M_append(local_220._M_local_buf,local_288._0_8_);
              compatibilityAgree_abi_cxx11_((string *)local_1e0,t,false);
              std::__cxx11::string::_M_append(local_220._M_local_buf,local_1e0._0_8_);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e0._0_8_ != &local_1d0) {
                operator_delete((void *)local_1e0._0_8_,(ulong)(local_1d0._M_allocated_capacity + 1)
                               );
              }
              if (bVar4) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
                psVar9 = local_268;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1e0,"Property ",9);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1e0,(psVar9->_M_dataplus)._M_p,
                                     psVar9->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10," on target \"",0xc);
                psVar11 = cmTarget::GetName_abi_cxx11_(local_290->Target);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,"\" is\nimplied to be ",0x13);
                if (defaultValue == (char *)0x0) {
                  std::ios::clear((int)poVar10 + (int)poVar10->_vptr_basic_ostream[-3]);
                }
                else {
                  sVar12 = strlen(defaultValue);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10,defaultValue,sVar12);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,
                           " because it was used to determine the link libraries\nalready. The INTERFACE_"
                           ,0x4c);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10," property on\ndependency \"",0x19);
                psVar9 = cmTarget::GetName_abi_cxx11_(pcVar1->Target);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,"\" is in conflict.\n",0x12);
                std::__cxx11::stringbuf::str();
                cmSystemTools::Error(&local_260);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_260._M_dataplus._M_p != &local_260.field_2) {
                  operator_delete(local_260._M_dataplus._M_p,
                                  local_260.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
                std::ios_base::~ios_base(local_170);
                iVar5 = 2;
              }
              else {
                iVar5 = 3;
              }
              local_2a0 = 0;
            }
          }
          else {
            std::__cxx11::string::_M_append(local_220._M_local_buf,local_288._0_8_);
            compatibilityAgree_abi_cxx11_((string *)local_1e0,t,false);
            std::__cxx11::string::_M_append(local_220._M_local_buf,local_1e0._0_8_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e0._0_8_ != &local_1d0) {
              operator_delete((void *)local_1e0._0_8_,(ulong)(local_1d0._M_allocated_capacity + 1));
            }
            iVar5 = 3;
            bVar4 = bVar4 != local_2a0._0_1_;
            if (bVar4) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0,"Property ",9)
              ;
              psVar9 = local_268;
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1e0,(local_268->_M_dataplus)._M_p,
                                   local_268->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10," on target \"",0xc);
              psVar11 = cmTarget::GetName_abi_cxx11_(local_290->Target);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar10,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,"\" does\nnot match the INTERFACE_",0x1f);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar10,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10," property requirement\nof dependency \"",0x25);
              psVar9 = cmTarget::GetName_abi_cxx11_(pcVar1->Target);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar10,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\".\n",3);
              std::__cxx11::stringbuf::str();
              cmSystemTools::Error(&local_260);
LAB_004c5b2c:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_260._M_dataplus._M_p != &local_260.field_2) {
                operator_delete(local_260._M_dataplus._M_p,
                                local_260.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
              std::ios_base::~ios_base(local_170);
              iVar5 = 2;
            }
          }
        }
        if ((cmLocalGenerator *)local_288._0_8_ != (cmLocalGenerator *)(local_288 + 0x10)) {
          operator_delete((void *)local_288._0_8_,CONCAT71(local_288._17_7_,local_288[0x10]) + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1f8);
      } while (((iVar5 == 3) || (iVar5 == 0)) && (ppcVar14 = ppcVar14 + 1, ppcVar14 != local_200));
    }
    pcVar1 = local_290;
    iVar5 = 0x7cebc6;
    if (local_2a0 != 0) {
      iVar5 = 0x832ab8;
    }
    local_1e0._0_8_ = &local_1d0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e0,iVar5,(local_2a0 ^ 5) + iVar5);
    compatibilityType_abi_cxx11_((string *)local_288,t);
    cmGeneratorTarget::ReportPropertyOrigin
              (pcVar1,local_268,(string *)local_1e0,(string *)&local_220,(string *)local_288);
    if ((cmLocalGenerator *)local_288._0_8_ != (cmLocalGenerator *)(local_288 + 0x10)) {
      operator_delete((void *)local_288._0_8_,CONCAT71(local_288._17_7_,local_288[0x10]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._0_8_ != &local_1d0) {
      operator_delete((void *)local_1e0._0_8_,(ulong)(local_1d0._M_allocated_capacity + 1));
    }
    if (local_298 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::default_delete<cmGeneratorExpressionInterpreter>::operator()
                ((default_delete<cmGeneratorExpressionInterpreter> *)&local_298,
                 (cmGeneratorExpressionInterpreter *)local_298);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    bVar4 = local_2a0._0_1_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_allocated_capacity != &local_210) {
      operator_delete((void *)local_220._M_allocated_capacity,local_210._M_allocated_capacity + 1);
    }
  }
  local_2a0._0_1_ = bVar4;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return local_2a0._0_1_;
}

Assistant:

PropertyType checkInterfacePropertyCompatibility(cmGeneratorTarget const* tgt,
                                                 const std::string& p,
                                                 const std::string& config,
                                                 const char* defaultValue,
                                                 CompatibleType t,
                                                 PropertyType* /*unused*/)
{
  PropertyType propContent = getTypedProperty<PropertyType>(tgt, p);

  std::vector<std::string> headPropKeys = tgt->GetPropertyKeys();
  const bool explicitlySet = cm::contains(headPropKeys, p);

  const bool impliedByUse = tgt->IsNullImpliedByLinkLibraries(p);
  assert((impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet));

  std::vector<cmGeneratorTarget const*> const& deps =
    tgt->GetLinkImplementationClosure(config);

  if (deps.empty()) {
    return propContent;
  }
  bool propInitialized = explicitlySet;

  std::string report = cmStrCat(" * Target \"", tgt->GetName());
  if (explicitlySet) {
    report += "\" has property content \"";
    report += valueAsString<PropertyType>(propContent);
    report += "\"\n";
  } else if (impliedByUse) {
    report += "\" property is implied by use.\n";
  } else {
    report += "\" property not set.\n";
  }

  std::string interfaceProperty = "INTERFACE_" + p;
  std::unique_ptr<cmGeneratorExpressionInterpreter> genexInterpreter;
  if (p == "POSITION_INDEPENDENT_CODE") {
    genexInterpreter = cm::make_unique<cmGeneratorExpressionInterpreter>(
      tgt->GetLocalGenerator(), config, tgt);
  }

  for (cmGeneratorTarget const* theTarget : deps) {
    // An error should be reported if one dependency
    // has INTERFACE_POSITION_INDEPENDENT_CODE ON and the other
    // has INTERFACE_POSITION_INDEPENDENT_CODE OFF, or if the
    // target itself has a POSITION_INDEPENDENT_CODE which disagrees
    // with a dependency.

    std::vector<std::string> propKeys = theTarget->GetPropertyKeys();

    const bool ifaceIsSet = cm::contains(propKeys, interfaceProperty);
    PropertyType ifacePropContent = getTypedProperty<PropertyType>(
      theTarget, interfaceProperty, genexInterpreter.get());

    std::string reportEntry;
    if (ifaceIsSet) {
      reportEntry += " * Target \"";
      reportEntry += theTarget->GetName();
      reportEntry += "\" property value \"";
      reportEntry += valueAsString<PropertyType>(ifacePropContent);
      reportEntry += "\" ";
    }

    if (explicitlySet) {
      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" does\nnot match the "
               "INTERFACE_"
            << p
            << " property requirement\nof "
               "dependency \""
            << theTarget->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Explicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (impliedByUse) {
      propContent = impliedValue<PropertyType>(propContent);

      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" is\nimplied to be " << defaultValue
            << " because it was used to determine the link libraries\n"
               "already. The INTERFACE_"
            << p << " property on\ndependency \"" << theTarget->GetName()
            << "\" is in conflict.\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Implicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (ifaceIsSet) {
      if (propInitialized) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "The INTERFACE_" << p << " property of \""
            << theTarget->GetName() << "\" does\nnot agree with the value of "
            << p << " already determined\nfor \"" << tgt->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      report += reportEntry + "(Interface set)\n";
      propContent = ifacePropContent;
      propInitialized = true;
    } else {
      // Not set. Nothing to agree on.
      continue;
    }
  }

  tgt->ReportPropertyOrigin(p, valueAsString<PropertyType>(propContent),
                            report, compatibilityType(t));
  return propContent;
}